

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.c
# Opt level: O1

int main(int argc,char **argv)

{
  cf_bool_t cVar1;
  
  cf_memchk_init();
  test_array_expand();
  test_array_insert_front_back();
  test_array_insert_to_position();
  test_array_find();
  cVar1 = cf_memchk_deinit_and_summary();
  if (cVar1 != 0) {
    return 0;
  }
  __assert_fail("cf_memchk_deinit_and_summary()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_array.c"
                ,0x5f,"int main(int, char **)");
}

Assistant:

int main(int argc, char* argv[]) {
    cf_memchk_init();
    test_array_expand();
    test_array_insert_front_back();
    test_array_insert_to_position();
    test_array_find();
    cf_assert(cf_memchk_deinit_and_summary());
    return 0;
}